

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::computeFrhs(SPxSolverBase<double> *this)

{
  Representation RVar1;
  Status SVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  Status *pSVar6;
  VectorBase<double> *pVVar7;
  SVSetBase<double> *pSVar8;
  Item *pIVar9;
  vector<double,_std::allocator<double>_> *__range2;
  long lVar10;
  undefined8 *puVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  VectorBase<double> *pVVar16;
  long lVar17;
  int *piVar18;
  double dVar19;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->theRep == COLUMN) {
    pdVar4 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar5) {
      memset(pdVar4,0,(long)pdVar5 - (long)pdVar4 & 0xfffffffffffffff8);
    }
    if (this->theType != LEAVE) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7a])(this);
    lVar10 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar10) {
      pSVar6 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      RVar1 = this->theRep;
      pVVar7 = this->theFrhs;
      lVar15 = 0;
      do {
        SVar2 = pSVar6[lVar15];
        if (RVar1 * SVar2 < 1) {
          pVVar16 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right;
          switch(SVar2) {
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ESVECS01 ERROR: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_40 = local_30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"XSVECS01 This should never happen.","");
            *puVar11 = &PTR__SPxException_006a9ee8;
            puVar11[1] = puVar11 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar11 + 1),local_40,local_40 + local_38);
            *puVar11 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          case P_ON_LOWER:
            pVVar16 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left;
          case P_FIXED:
          case P_ON_UPPER:
            pdVar4 = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[lVar15] =
                 (pVVar16->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15] + pdVar4[lVar15];
            break;
          case P_FREE:
            break;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar10 != lVar15);
    }
  }
  else if (this->theType == ENTER) {
    pdVar4 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar5) {
      memset(pdVar4,0,(long)pdVar5 - (long)pdVar4 & 0xfffffffffffffff8);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
              (this,this->theUbound,this->theLbound);
    computeFrhs2(this,this->theCoUbound,this->theCoLbound);
    pdVar4 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (uint)((ulong)((long)(this->theFrhs->val).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
    if (0 < (int)uVar12) {
      pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar14 = 0;
      do {
        pdVar4[uVar14] = pdVar5[uVar14] + pdVar4[uVar14];
        uVar14 = uVar14 + 1;
      } while ((uVar12 & 0x7fffffff) != uVar14);
    }
  }
  else {
    VectorBase<double>::operator=
              (this->theFrhs,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object);
    lVar10 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar10) {
      pSVar6 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      RVar1 = this->theRep;
      pdVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pSVar8 = this->thevectors;
      pVVar7 = this->theFrhs;
      lVar15 = 0;
      do {
        SVar2 = pSVar6[lVar15];
        if (RVar1 * SVar2 < 1) {
          dVar19 = 0.0;
          switch(SVar2) {
          case D_FREE:
            break;
          case D_ON_UPPER:
          case D_ON_LOWER:
          case D_ON_BOTH:
            dVar19 = pdVar4[lVar15];
          default:
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              pIVar9 = (pSVar8->set).theitem;
              iVar3 = (pSVar8->set).thekey[lVar15].idx;
              lVar17 = (long)pIVar9[iVar3].data.super_SVectorBase<double>.memused;
              if (0 < lVar17) {
                pdVar5 = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar13 = lVar17 + 1;
                piVar18 = &pIVar9[iVar3].data.super_SVectorBase<double>.m_elem[lVar17 + -1].idx;
                do {
                  pdVar5[*piVar18] =
                       ((Nonzero<double> *)(piVar18 + -2))->val * dVar19 + pdVar5[*piVar18];
                  lVar13 = lVar13 + -1;
                  piVar18 = piVar18 + -4;
                } while (1 < lVar13);
              }
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar10);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}